

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestRuntimeFail.cpp
# Opt level: O0

void __thiscall Test_testMultipleTransitions::Run(Test_testMultipleTransitions *this)

{
  nullres nVar1;
  int iVar2;
  char *pcVar3;
  char *__s2;
  char *local_30;
  char *targetName;
  nullres good;
  int t;
  Test_testMultipleTransitions *this_local;
  
  if ((Tests::messageVerbose & 1) != 0) {
    printf("Call stack when there are various transitions between NULLC and C\r\n");
  }
  targetName._4_4_ = 0;
  do {
    if (2 < targetName._4_4_) {
      return;
    }
    if ((*(byte *)((long)&Tests::testFailureExecutor + (long)targetName._4_4_) & 1) != 0) {
      testsCount[targetName._4_4_] = testsCount[targetName._4_4_] + 1;
      nullcSetExecutor(testTarget[targetName._4_4_]);
      nVar1 = nullcBuild(testCallStackWhenVariousTransitions);
      if (nVar1 == '\0') {
        if ((Tests::messageVerbose & 1) == 0) {
          printf("Call stack when there are various transitions between NULLC and C\r\n");
        }
        pcVar3 = nullcGetLastError();
        printf("Compilation failed: %s\r\n",pcVar3);
        return;
      }
      nVar1 = nullcRun();
      pcVar3 = error;
      if (nVar1 == '\0') {
        __s2 = nullcGetLastError();
        iVar2 = strcmp(pcVar3,__s2);
        if (iVar2 == 0) {
          testsPassed[targetName._4_4_] = testsPassed[targetName._4_4_] + 1;
        }
        else {
          if ((Tests::messageVerbose & 1) == 0) {
            printf("Call stack when there are various transitions between NULLC and C\r\n");
          }
          if (testTarget[targetName._4_4_] == 1) {
            local_30 = "X86";
          }
          else {
            local_30 = "REGVM";
            if (testTarget[targetName._4_4_] == 2) {
              local_30 = "LLVM";
            }
          }
          pcVar3 = nullcGetLastError();
          printf("%s failed but for wrong reason:\r\n    %s\r\nexpected:\r\n    %s\r\n",local_30,
                 pcVar3,error);
        }
      }
      else {
        if ((Tests::messageVerbose & 1) == 0) {
          printf("Call stack when there are various transitions between NULLC and C\r\n");
        }
        printf("Test should have failed.\r\n");
      }
    }
    targetName._4_4_ = targetName._4_4_ + 1;
  } while( true );
}

Assistant:

virtual void Run()
	{
		if(Tests::messageVerbose)
			printf("Call stack when there are various transitions between NULLC and C\r\n");
		for(int t = 0; t < TEST_TARGET_COUNT; t++)
		{
			if(!Tests::testFailureExecutor[t])
				continue;
			testsCount[t]++;
			nullcSetExecutor(testTarget[t]);
			nullres good = nullcBuild(testCallStackWhenVariousTransitions);
			if(!good)
			{
				if(!Tests::messageVerbose)
					printf("Call stack when there are various transitions between NULLC and C\r\n");
				printf("Compilation failed: %s\r\n", nullcGetLastError());
				break;
			}
			good = nullcRun();
			if(!good)
			{
				if(strcmp(error, nullcGetLastError()) != 0)
				{
					if(!Tests::messageVerbose)
						printf("Call stack when there are various transitions between NULLC and C\r\n");

					const char *targetName = testTarget[t] == NULLC_X86 ? "X86" : (testTarget[t] == NULLC_LLVM ? "LLVM" : "REGVM");

					printf("%s failed but for wrong reason:\r\n    %s\r\nexpected:\r\n    %s\r\n", targetName, nullcGetLastError(), error);
				}else{
					testsPassed[t]++;
				}
			}else{
				if(!Tests::messageVerbose)
					printf("Call stack when there are various transitions between NULLC and C\r\n");
				printf("Test should have failed.\r\n");
			}
		}
	}